

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cookie.c
# Opt level: O1

int mbedtls_ssl_cookie_setup
              (mbedtls_ssl_cookie_ctx *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  mbedtls_md_info_t *md_info;
  long lVar2;
  uchar key [32];
  uchar local_28 [32];
  
  iVar1 = (*f_rng)(p_rng,local_28,0x20);
  if (iVar1 == 0) {
    md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA224);
    iVar1 = mbedtls_md_setup(&ctx->hmac_ctx,md_info,1);
    if (iVar1 == 0) {
      iVar1 = mbedtls_md_hmac_starts(&ctx->hmac_ctx,local_28,0x20);
      if (iVar1 == 0) {
        iVar1 = 0;
        lVar2 = 0;
        do {
          local_28[lVar2] = '\0';
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x20);
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_cookie_setup( mbedtls_ssl_cookie_ctx *ctx,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    int ret;
    unsigned char key[COOKIE_MD_OUTLEN];

    if( ( ret = f_rng( p_rng, key, sizeof( key ) ) ) != 0 )
        return( ret );

    ret = mbedtls_md_setup( &ctx->hmac_ctx, mbedtls_md_info_from_type( COOKIE_MD ), 1 );
    if( ret != 0 )
        return( ret );

    ret = mbedtls_md_hmac_starts( &ctx->hmac_ctx, key, sizeof( key ) );
    if( ret != 0 )
        return( ret );

    mbedtls_zeroize( key, sizeof( key ) );

    return( 0 );
}